

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int eval_expr_select(lyxp_expr *exp,uint16_t *exp_idx,lyxp_expr_type etype,lyd_node *cur_node,
                    lys_module *param_5,lyxp_set *set,int options)

{
  lyxp_expr_type *plVar1;
  uint16_t uVar2;
  uint16_t *puVar3;
  undefined8 __s;
  lys_module *plVar4;
  undefined8 uVar5;
  ushort uVar6;
  int iVar7;
  int iVar8;
  lys_node *plVar9;
  char *pcVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  char *pcVar11;
  size_t sVar12;
  lyxp_set_node *__s_00;
  ulong uVar13;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  lyd_node *plVar14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  lyxp_set *plVar15;
  lys_module *plVar16;
  ulong uVar17;
  ushort uVar18;
  ly_ctx *plVar19;
  ushort uVar20;
  ushort uVar21;
  bool bVar22;
  undefined1 auStack_f8 [8];
  lyxp_node_type root_type;
  anon_union_16_6_eb7c38b1_for_val local_e8;
  undefined8 local_d8;
  hash_table *phStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  lyxp_expr *local_b8;
  lyxp_set_node *local_b0;
  lyxp_set local_a8;
  char *local_60;
  lyxp_set *local_58;
  uint16_t *local_50;
  undefined8 local_48;
  lyd_node *local_40;
  lys_module *local_38;
  
  uVar17 = (ulong)*exp_idx;
  plVar1 = exp->repeat[uVar17];
  local_58 = set;
  local_50 = exp_idx;
  local_40 = cur_node;
  if (plVar1 != (lyxp_expr_type *)0x0) {
    uVar6 = 0xffff;
    do {
      uVar6 = uVar6 + 1;
    } while (etype < plVar1[uVar6]);
    if (uVar6 != 0) {
      uVar18 = 0;
      uVar20 = uVar6;
      while ((uVar21 = uVar6, uVar20 != 0 &&
             (uVar21 = uVar18, plVar1[uVar20 - 1] == plVar1[uVar6 - 1]))) {
        uVar18 = uVar18 + 1;
        uVar20 = uVar20 - 1;
      }
      switch(plVar1[uVar6 - 1]) {
      case LYXP_EXPR_NONE:
        goto switchD_0016dc3f_caseD_0;
      case LYXP_EXPR_OR:
        if (uVar21 == 0) {
          __assert_fail("repeat",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                        ,0x206c,
                        "int eval_or_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                       );
        }
        local_c8._0_4_ = 0;
        local_c8._4_4_ = 0;
        uStack_c0 = 0;
        local_d8._0_4_ = 0;
        local_d8._4_4_ = 0;
        phStack_d0 = (hash_table *)0x0;
        local_e8.nodes = (lyxp_set_node *)0x0;
        local_e8._8_8_ = 0;
        auStack_f8 = (undefined1  [8])0x0;
        _root_type = 0;
        local_a8.type = LYXP_SET_EMPTY;
        local_a8._4_4_ = 0;
        local_a8._8_8_ = 0;
        local_a8.val.nodes = (lyxp_set_node *)0x0;
        local_a8.val._8_8_ = 0;
        local_a8.used = 0;
        local_a8.size = 0;
        local_a8.ht = (hash_table *)0x0;
        local_a8.ctx_pos = 0;
        local_a8.ctx_size = 0;
        local_a8._56_8_ = 0;
        set_fill_set((lyxp_set *)auStack_f8,set);
        iVar7 = eval_expr_select(exp,local_50,LYXP_EXPR_OR,local_40,param_5,set,options);
        uVar5 = CONCAT44(extraout_var_05,iVar7);
        if (iVar7 == 0) {
          if ((options & 0x1cU) == 0 || set == (lyxp_set *)0x0) {
            local_38 = param_5;
            lyxp_set_cast(set,LYXP_SET_BOOLEAN,local_40,param_5,options);
          }
          else {
            local_38 = param_5;
            set_snode_clear_ctx(set);
          }
          local_48 = 0;
LAB_0016f078:
          do {
            bVar22 = uVar21 == 0;
            uVar21 = uVar21 - 1;
            param_5 = local_38;
            uVar5 = local_48;
            if (bVar22) break;
            if (exp->tokens[*local_50] != LYXP_TOKEN_OPERATOR_LOG) {
              __assert_fail("exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_LOG",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                            ,0x2081,
                            "int eval_or_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                           );
            }
            if (set == (lyxp_set *)0x0) {
              ly_log_dbg(8,"%-27s %s %s[%u]","eval_or_expr","skipped","Operator(Logic)");
              *local_50 = *local_50 + 1;
            }
            else {
              pcVar10 = "skipped";
              if ((set->val).bool == 0) {
                pcVar10 = "parsed";
              }
              ly_log_dbg(8,"%-27s %s %s[%u]","eval_or_expr",pcVar10,"Operator(Logic)");
              puVar3 = local_50;
              *local_50 = *local_50 + 1;
              if ((set->type != LYXP_SET_BOOLEAN) || ((set->val).bool == 0)) {
                set_fill_set(&local_a8,(lyxp_set *)auStack_f8);
                iVar7 = eval_expr_select(exp,puVar3,LYXP_EXPR_OR,local_40,local_38,&local_a8,options
                                        );
                param_5 = local_38;
                uVar5 = CONCAT44(extraout_var_17,iVar7);
                if (iVar7 != 0) break;
                if (set->type == LYXP_SET_SNODE_SET) {
                  set_snode_clear_ctx(&local_a8);
                  set_snode_merge(set,&local_a8);
                }
                else {
                  lyxp_set_cast(&local_a8,LYXP_SET_BOOLEAN,local_40,local_38,options);
                  set_fill_set(set,&local_a8);
                }
                goto LAB_0016f078;
              }
            }
            iVar7 = eval_expr_select(exp,local_50,LYXP_EXPR_OR,local_40,local_38,(lyxp_set *)0x0,
                                     options);
            param_5 = local_38;
            uVar5 = CONCAT44(extraout_var_18,iVar7);
          } while (iVar7 == 0);
        }
        break;
      case LYXP_EXPR_AND:
        if (uVar21 == 0) {
          __assert_fail("repeat",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                        ,0x201e,
                        "int eval_and_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                       );
        }
        local_c8._0_4_ = 0;
        local_c8._4_4_ = 0;
        uStack_c0 = 0;
        local_d8._0_4_ = 0;
        local_d8._4_4_ = 0;
        phStack_d0 = (hash_table *)0x0;
        local_e8.nodes = (lyxp_set_node *)0x0;
        local_e8._8_8_ = 0;
        auStack_f8 = (undefined1  [8])0x0;
        _root_type = 0;
        local_a8.type = LYXP_SET_EMPTY;
        local_a8._4_4_ = 0;
        local_a8._8_8_ = 0;
        local_a8.val.nodes = (lyxp_set_node *)0x0;
        local_a8.val._8_8_ = 0;
        local_a8.used = 0;
        local_a8.size = 0;
        local_a8.ht = (hash_table *)0x0;
        local_a8.ctx_pos = 0;
        local_a8.ctx_size = 0;
        local_a8._56_8_ = 0;
        set_fill_set((lyxp_set *)auStack_f8,set);
        iVar7 = eval_expr_select(exp,local_50,LYXP_EXPR_AND,local_40,param_5,set,options);
        uVar5 = CONCAT44(extraout_var_02,iVar7);
        if (iVar7 == 0) {
          if ((options & 0x1cU) == 0 || set == (lyxp_set *)0x0) {
            local_38 = param_5;
            lyxp_set_cast(set,LYXP_SET_BOOLEAN,local_40,param_5,options);
          }
          else {
            local_38 = param_5;
            set_snode_clear_ctx(set);
          }
          local_48 = 0;
LAB_0016eed5:
          do {
            bVar22 = uVar21 == 0;
            uVar21 = uVar21 - 1;
            param_5 = local_38;
            uVar5 = local_48;
            if (bVar22) break;
            if (exp->tokens[*local_50] != LYXP_TOKEN_OPERATOR_LOG) {
              __assert_fail("exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_LOG",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                            ,0x2033,
                            "int eval_and_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                           );
            }
            if (set == (lyxp_set *)0x0) {
              ly_log_dbg(8,"%-27s %s %s[%u]","eval_and_expr","skipped","Operator(Logic)");
              *local_50 = *local_50 + 1;
            }
            else {
              pcVar10 = "parsed";
              if ((set->val).bool == 0) {
                pcVar10 = "skipped";
              }
              ly_log_dbg(8,"%-27s %s %s[%u]","eval_and_expr",pcVar10,"Operator(Logic)");
              puVar3 = local_50;
              *local_50 = *local_50 + 1;
              if ((set->type != LYXP_SET_BOOLEAN) || ((set->val).bool != 0)) {
                set_fill_set(&local_a8,(lyxp_set *)auStack_f8);
                iVar7 = eval_expr_select(exp,puVar3,LYXP_EXPR_AND,local_40,local_38,&local_a8,
                                         options);
                param_5 = local_38;
                uVar5 = CONCAT44(extraout_var_15,iVar7);
                if (iVar7 != 0) break;
                if (set->type == LYXP_SET_SNODE_SET) {
                  set_snode_clear_ctx(&local_a8);
                  set_snode_merge(set,&local_a8);
                }
                else {
                  lyxp_set_cast(&local_a8,LYXP_SET_BOOLEAN,local_40,local_38,options);
                  set_fill_set(set,&local_a8);
                }
                goto LAB_0016eed5;
              }
            }
            iVar7 = eval_expr_select(exp,local_50,LYXP_EXPR_AND,local_40,local_38,(lyxp_set *)0x0,
                                     options);
            param_5 = local_38;
            uVar5 = CONCAT44(extraout_var_16,iVar7);
          } while (iVar7 == 0);
        }
        break;
      case LYXP_EXPR_EQUALITY:
        if (uVar21 == 0) {
          __assert_fail("repeat",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                        ,0x1fc0,
                        "int eval_equality_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                       );
        }
        local_c8._0_4_ = 0;
        local_c8._4_4_ = 0;
        uStack_c0 = 0;
        local_d8._0_4_ = 0;
        local_d8._4_4_ = 0;
        phStack_d0 = (hash_table *)0x0;
        local_e8.nodes = (lyxp_set_node *)0x0;
        local_e8._8_8_ = 0;
        auStack_f8 = (undefined1  [8])0x0;
        _root_type = 0;
        local_a8.type = LYXP_SET_EMPTY;
        local_a8._4_4_ = 0;
        local_a8._8_8_ = 0;
        local_a8.val.nodes = (lyxp_set_node *)0x0;
        local_a8.val._8_8_ = 0;
        local_a8.used = 0;
        local_a8.size = 0;
        local_a8.ht = (hash_table *)0x0;
        local_a8.ctx_pos = 0;
        local_a8.ctx_size = 0;
        local_a8._56_8_ = 0;
        set_fill_set((lyxp_set *)auStack_f8,set);
        iVar7 = eval_expr_select(exp,local_50,LYXP_EXPR_EQUALITY,local_40,param_5,set,options);
        uVar5 = CONCAT44(extraout_var_03,iVar7);
        if (iVar7 == 0) {
          pcVar10 = "parsed";
          if (set == (lyxp_set *)0x0) {
            pcVar10 = "skipped";
          }
          local_48 = 0;
          plVar16 = param_5;
          local_38 = param_5;
          while (puVar3 = local_50, bVar22 = uVar21 != 0, uVar21 = uVar21 - 1, param_5 = plVar16,
                uVar5 = local_48, bVar22) {
            if (exp->tokens[(long)(ulong)*local_50] != LYXP_TOKEN_OPERATOR_COMP) {
              __assert_fail("exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_COMP",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                            ,0x1fd0,
                            "int eval_equality_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                           );
            }
            local_60 = (char *)(ulong)*local_50;
            ly_log_dbg(8,"%-27s %s %s[%u]","eval_equality_expr",pcVar10,"Operator(Comparison)");
            *puVar3 = *puVar3 + 1;
            if (set == (lyxp_set *)0x0) {
              iVar7 = eval_expr_select(exp,puVar3,LYXP_EXPR_EQUALITY,local_40,plVar16,
                                       (lyxp_set *)0x0,options);
              if (iVar7 != 0) {
                return iVar7;
              }
            }
            else {
              set_fill_set(&local_a8,(lyxp_set *)auStack_f8);
              iVar7 = eval_expr_select(exp,puVar3,LYXP_EXPR_EQUALITY,local_40,plVar16,&local_a8,
                                       options);
              set = local_58;
              __s = local_a8.val.nodes;
              uVar5 = CONCAT44(extraout_var_04,iVar7);
              if (iVar7 != 0) break;
              if ((options & 0x1cU) == 0) {
                if (((local_58->type == LYXP_SET_NODE_SET) &&
                    (plVar9 = ((local_58->val).nodes)->node->schema,
                    (plVar9->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN)) &&
                   ((*(int *)&plVar9[1].ref == 7 &&
                    ((local_a8.type == LYXP_SET_STRING &&
                     (pcVar11 = strchr(local_a8.val.str,0x3a), pcVar11 == (char *)0x0)))))) {
                  local_b0 = (lyxp_set_node *)strlen(plVar16->name);
                  sVar12 = strlen((char *)__s);
                  __s_00 = (lyxp_set_node *)
                           ly_realloc((void *)__s,(size_t)((long)&local_b0->node + sVar12 + 2));
                  param_5 = local_38;
                  local_a8.val.str = (char *)__s_00;
                  uVar5 = local_48;
                  if (__s_00 == (lyxp_set_node *)0x0) break;
                  sVar12 = strlen(local_38->name);
                  local_b0 = (lyxp_set_node *)((long)&__s_00->node + sVar12 + 1);
                  sVar12 = strlen((char *)__s_00);
                  memmove(local_b0,__s_00,sVar12 + 1);
                  plVar4 = local_38;
                  local_b0 = local_a8.val.nodes;
                  pcVar11 = local_38->name;
                  sVar12 = strlen(pcVar11);
                  memcpy(local_b0,pcVar11,sVar12);
                  local_b0 = local_a8.val.nodes;
                  sVar12 = strlen(plVar4->name);
                  *(char *)((long)&local_b0->node + sVar12) = ':';
                }
                iVar7 = moveto_op_comp(set,&local_a8,exp->expr + exp->expr_pos[(long)local_60],
                                       local_40,plVar16,options);
                if (iVar7 != 0) {
                  param_5 = plVar16;
                  uVar5 = 0xffffffffffffffff;
                  break;
                }
              }
              else {
                uVar2 = (short)local_60 - 1;
                warn_operands(plVar16->ctx,local_58,&local_a8,0,exp->expr,
                              exp->expr_pos[(long)(local_60 + -1)]);
                puVar3 = local_50;
                warn_equality_value(local_38->ctx,exp,set,*local_50 - 1,uVar2,*local_50 - 1);
                plVar16 = local_38;
                warn_equality_value(local_38->ctx,exp,&local_a8,uVar2,uVar2,*puVar3 - 1);
                set_snode_merge(set,&local_a8);
                set_snode_clear_ctx(set);
              }
            }
          }
        }
        break;
      case LYXP_EXPR_RELATIONAL:
        if (uVar21 == 0) {
          __assert_fail("repeat",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                        ,0x1f73,
                        "int eval_relational_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                       );
        }
        local_c8._0_4_ = 0;
        local_c8._4_4_ = 0;
        uStack_c0 = 0;
        local_d8._0_4_ = 0;
        local_d8._4_4_ = 0;
        phStack_d0 = (hash_table *)0x0;
        local_e8.nodes = (lyxp_set_node *)0x0;
        local_e8._8_8_ = 0;
        auStack_f8 = (undefined1  [8])0x0;
        _root_type = 0;
        local_a8.type = LYXP_SET_EMPTY;
        local_a8._4_4_ = 0;
        local_a8._8_8_ = 0;
        local_a8.val.nodes = (lyxp_set_node *)0x0;
        local_a8.val._8_8_ = 0;
        local_a8.used = 0;
        local_a8.size = 0;
        local_a8.ht = (hash_table *)0x0;
        local_a8.ctx_pos = 0;
        local_a8.ctx_size = 0;
        local_a8._56_8_ = 0;
        set_fill_set((lyxp_set *)auStack_f8,set);
        iVar7 = eval_expr_select(exp,local_50,LYXP_EXPR_RELATIONAL,local_40,param_5,set,options);
        uVar5 = CONCAT44(extraout_var,iVar7);
        if (iVar7 == 0) {
          local_60 = "parsed";
          if (set == (lyxp_set *)0x0) {
            local_60 = "skipped";
          }
          local_48 = 0;
          local_38 = param_5;
          do {
            while( true ) {
              puVar3 = local_50;
              bVar22 = uVar21 == 0;
              uVar21 = uVar21 - 1;
              param_5 = local_38;
              uVar5 = local_48;
              if (bVar22) goto LAB_0016ed2e;
              uVar17 = (ulong)*local_50;
              if (exp->tokens[uVar17] != LYXP_TOKEN_OPERATOR_COMP) {
                __assert_fail("exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_COMP",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                              ,0x1f83,
                              "int eval_relational_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                             );
              }
              ly_log_dbg(8,"%-27s %s %s[%u]","eval_relational_expr",local_60,"Operator(Comparison)")
              ;
              *puVar3 = *puVar3 + 1;
              if (set == (lyxp_set *)0x0) break;
              set_fill_set(&local_a8,(lyxp_set *)auStack_f8);
              iVar7 = eval_expr_select(exp,puVar3,LYXP_EXPR_RELATIONAL,local_40,local_38,&local_a8,
                                       options);
              set = local_58;
              param_5 = local_38;
              uVar5 = CONCAT44(extraout_var_00,iVar7);
              if (iVar7 != 0) goto LAB_0016ed2e;
              if ((options & 0x1cU) == 0) {
                iVar7 = moveto_op_comp(local_58,&local_a8,exp->expr + exp->expr_pos[uVar17],local_40
                                       ,local_38,options);
                if (iVar7 != 0) goto LAB_0016ed23;
              }
              else {
                warn_operands(local_38->ctx,local_58,&local_a8,1,exp->expr,exp->expr_pos[uVar17 - 1]
                             );
                set_snode_merge(set,&local_a8);
                set_snode_clear_ctx(set);
              }
            }
            iVar7 = eval_expr_select(exp,puVar3,LYXP_EXPR_RELATIONAL,local_40,local_38,
                                     (lyxp_set *)0x0,options);
            param_5 = local_38;
            uVar5 = CONCAT44(extraout_var_01,iVar7);
          } while (iVar7 == 0);
        }
        break;
      case LYXP_EXPR_ADDITIVE:
        if (uVar21 == 0) {
          __assert_fail("repeat",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                        ,0x1f24,
                        "int eval_additive_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                       );
        }
        local_c8._0_4_ = 0;
        local_c8._4_4_ = 0;
        uStack_c0 = 0;
        local_d8._0_4_ = 0;
        local_d8._4_4_ = 0;
        phStack_d0 = (hash_table *)0x0;
        local_e8.nodes = (lyxp_set_node *)0x0;
        local_e8._8_8_ = 0;
        auStack_f8 = (undefined1  [8])0x0;
        _root_type = 0;
        local_a8.type = LYXP_SET_EMPTY;
        local_a8._4_4_ = 0;
        local_a8._8_8_ = 0;
        local_a8.val.nodes = (lyxp_set_node *)0x0;
        local_a8.val._8_8_ = 0;
        local_a8.used = 0;
        local_a8.size = 0;
        local_a8.ht = (hash_table *)0x0;
        local_a8.ctx_pos = 0;
        local_a8.ctx_size = 0;
        local_a8._56_8_ = 0;
        set_fill_set((lyxp_set *)auStack_f8,set);
        iVar7 = eval_expr_select(exp,local_50,LYXP_EXPR_ADDITIVE,local_40,param_5,set,options);
        uVar5 = CONCAT44(extraout_var_06,iVar7);
        if (iVar7 == 0) {
          local_60 = "parsed";
          if (set == (lyxp_set *)0x0) {
            local_60 = "skipped";
          }
          local_48 = 0;
          do {
            while( true ) {
              puVar3 = local_50;
              bVar22 = uVar21 == 0;
              uVar21 = uVar21 - 1;
              uVar5 = local_48;
              if (bVar22) goto LAB_0016ed2e;
              uVar17 = (ulong)*local_50;
              if (exp->tokens[uVar17] != LYXP_TOKEN_OPERATOR_MATH) {
                __assert_fail("exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_MATH",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                              ,0x1f34,
                              "int eval_additive_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                             );
              }
              ly_log_dbg(8,"%-27s %s %s[%u]","eval_additive_expr",local_60,"Operator(Math)");
              *puVar3 = *puVar3 + 1;
              if (local_58 == (lyxp_set *)0x0) break;
              set_fill_set(&local_a8,(lyxp_set *)auStack_f8);
              iVar7 = eval_expr_select(exp,local_50,LYXP_EXPR_ADDITIVE,local_40,param_5,&local_a8,
                                       options);
              plVar15 = local_58;
              uVar5 = CONCAT44(extraout_var_07,iVar7);
              if (iVar7 != 0) goto LAB_0016ed2e;
              if ((options & 0x1cU) == 0) {
                iVar7 = moveto_op_math(local_58,&local_a8,exp->expr + exp->expr_pos[uVar17],local_40
                                       ,param_5,options);
                uVar5 = local_48;
                if (iVar7 != 0) goto LAB_0016ed2e;
              }
              else {
                warn_operands(param_5->ctx,local_58,&local_a8,1,exp->expr,exp->expr_pos[uVar17 - 1])
                ;
                set_snode_merge(plVar15,&local_a8);
                set_snode_clear_ctx(plVar15);
              }
            }
            iVar7 = eval_expr_select(exp,puVar3,LYXP_EXPR_ADDITIVE,local_40,param_5,(lyxp_set *)0x0,
                                     options);
            uVar5 = CONCAT44(extraout_var_08,iVar7);
          } while (iVar7 == 0);
        }
        break;
      case LYXP_EXPR_MULTIPLICATIVE:
        if (uVar21 == 0) {
          __assert_fail("repeat",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                        ,0x1ed6,
                        "int eval_multiplicative_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                       );
        }
        local_c8._0_4_ = 0;
        local_c8._4_4_ = 0;
        uStack_c0 = 0;
        local_d8._0_4_ = 0;
        local_d8._4_4_ = 0;
        phStack_d0 = (hash_table *)0x0;
        local_e8.nodes = (lyxp_set_node *)0x0;
        local_e8._8_8_ = 0;
        auStack_f8 = (undefined1  [8])0x0;
        _root_type = 0;
        local_a8.type = LYXP_SET_EMPTY;
        local_a8._4_4_ = 0;
        local_a8._8_8_ = 0;
        local_a8.val.nodes = (lyxp_set_node *)0x0;
        local_a8.val._8_8_ = 0;
        local_a8.used = 0;
        local_a8.size = 0;
        local_a8.ht = (hash_table *)0x0;
        local_a8.ctx_pos = 0;
        local_a8.ctx_size = 0;
        local_a8._56_8_ = 0;
        set_fill_set((lyxp_set *)auStack_f8,set);
        iVar7 = eval_expr_select(exp,local_50,LYXP_EXPR_MULTIPLICATIVE,local_40,param_5,set,options)
        ;
        uVar5 = CONCAT44(extraout_var_09,iVar7);
        if (iVar7 == 0) {
          local_60 = "parsed";
          if (set == (lyxp_set *)0x0) {
            local_60 = "skipped";
          }
          local_48 = 0;
          local_38 = param_5;
          do {
            while( true ) {
              puVar3 = local_50;
              bVar22 = uVar21 == 0;
              uVar21 = uVar21 - 1;
              param_5 = local_38;
              uVar5 = local_48;
              if (bVar22) goto LAB_0016ed2e;
              uVar17 = (ulong)*local_50;
              if (exp->tokens[uVar17] != LYXP_TOKEN_OPERATOR_MATH) {
                __assert_fail("exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_MATH",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                              ,0x1ee6,
                              "int eval_multiplicative_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                             );
              }
              ly_log_dbg(8,"%-27s %s %s[%u]","eval_multiplicative_expr",local_60,"Operator(Math)");
              *puVar3 = *puVar3 + 1;
              if (set == (lyxp_set *)0x0) break;
              set_fill_set(&local_a8,(lyxp_set *)auStack_f8);
              iVar7 = eval_expr_select(exp,puVar3,LYXP_EXPR_MULTIPLICATIVE,local_40,local_38,
                                       &local_a8,options);
              set = local_58;
              param_5 = local_38;
              uVar5 = CONCAT44(extraout_var_10,iVar7);
              if (iVar7 != 0) goto LAB_0016ed2e;
              if ((options & 0x1cU) == 0) {
                iVar7 = moveto_op_math(local_58,&local_a8,exp->expr + exp->expr_pos[uVar17],local_40
                                       ,local_38,options);
                if (iVar7 != 0) goto LAB_0016ed23;
              }
              else {
                warn_operands(local_38->ctx,local_58,&local_a8,1,exp->expr,exp->expr_pos[uVar17 - 1]
                             );
                set_snode_merge(set,&local_a8);
                set_snode_clear_ctx(set);
              }
            }
            iVar7 = eval_expr_select(exp,puVar3,LYXP_EXPR_MULTIPLICATIVE,local_40,local_38,
                                     (lyxp_set *)0x0,options);
            param_5 = local_38;
            uVar5 = CONCAT44(extraout_var_11,iVar7);
          } while (iVar7 == 0);
        }
        break;
      case LYXP_EXPR_UNARY:
        if (uVar21 == 0) {
          local_38 = param_5;
          __assert_fail("repeat",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                        ,0x1e9f,
                        "int eval_unary_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                       );
        }
        pcVar10 = "parsed";
        uVar13 = uVar17;
        local_38 = param_5;
        uVar6 = uVar21;
        if (set == (lyxp_set *)0x0) {
          pcVar10 = "skipped";
        }
        while (plVar16 = local_38, plVar15 = local_58, uVar6 != 0) {
          if (((exp->used == (uint16_t)uVar13) ||
              (exp->tokens[uVar13 & 0xffff] != LYXP_TOKEN_OPERATOR_MATH)) ||
             (exp->expr[exp->expr_pos[uVar13 & 0xffff]] != '-')) {
            __assert_fail("!exp_check_token(local_mod->ctx, exp, *exp_idx, LYXP_TOKEN_OPERATOR_MATH, 0) && (exp->expr[exp->expr_pos[*exp_idx]] == \'-\')"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                          ,0x1ea4,
                          "int eval_unary_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                         );
          }
          ly_log_dbg(8,"%-27s %s %s[%u]","eval_unary_expr",pcVar10,"Operator(Math)");
          uVar20 = *local_50;
          *local_50 = (ushort)(uVar20 + 1);
          uVar13 = (ulong)(uVar20 + 1);
          uVar6 = uVar6 - 1;
        }
        iVar7 = eval_expr_select(exp,local_50,LYXP_EXPR_UNARY,local_40,local_38,local_58,options);
        if (iVar7 != 0) {
          return iVar7;
        }
        if ((uVar21 & 1) == 0 || plVar15 == (lyxp_set *)0x0) {
          return 0;
        }
        if ((options & 0x1cU) != 0) {
          warn_operands(plVar16->ctx,plVar15,(lyxp_set *)0x0,1,exp->expr,exp->expr_pos[uVar17]);
          return 0;
        }
        iVar7 = moveto_op_math(plVar15,(lyxp_set *)0x0,exp->expr + exp->expr_pos[uVar17],local_40,
                               plVar16,options);
        if (iVar7 == 0) {
          return 0;
        }
        return -1;
      case LYXP_EXPR_UNION:
        if (uVar21 == 0) {
          __assert_fail("repeat",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                        ,0x1e5b,
                        "int eval_union_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                       );
        }
        local_c8._0_4_ = 0;
        local_c8._4_4_ = 0;
        uStack_c0 = 0;
        local_d8._0_4_ = 0;
        local_d8._4_4_ = 0;
        phStack_d0 = (hash_table *)0x0;
        local_e8.nodes = (lyxp_set_node *)0x0;
        local_e8._8_8_ = 0;
        auStack_f8 = (undefined1  [8])0x0;
        _root_type = 0;
        local_a8.type = LYXP_SET_EMPTY;
        local_a8._4_4_ = 0;
        local_a8._8_8_ = 0;
        local_a8.val.nodes = (lyxp_set_node *)0x0;
        local_a8.val._8_8_ = 0;
        local_a8.used = 0;
        local_a8.size = 0;
        local_a8.ht = (hash_table *)0x0;
        local_a8.ctx_pos = 0;
        local_a8.ctx_size = 0;
        local_a8._56_8_ = 0;
        set_fill_set((lyxp_set *)auStack_f8,set);
        iVar7 = eval_expr_select(exp,local_50,LYXP_EXPR_UNION,local_40,param_5,set,options);
        puVar3 = local_50;
        uVar5 = CONCAT44(extraout_var_12,iVar7);
        if (iVar7 == 0) {
          local_60 = "parsed";
          if (set == (lyxp_set *)0x0) {
            local_60 = "skipped";
          }
          local_48 = 0;
          local_38 = param_5;
          do {
            while( true ) {
              bVar22 = uVar21 == 0;
              uVar21 = uVar21 - 1;
              param_5 = local_38;
              uVar5 = local_48;
              if (bVar22) goto LAB_0016ed2e;
              if (exp->tokens[*puVar3] != LYXP_TOKEN_OPERATOR_UNI) {
                __assert_fail("exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_UNI",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                              ,0x1e69,
                              "int eval_union_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                             );
              }
              ly_log_dbg(8,"%-27s %s %s[%u]","eval_union_expr",local_60,"Operator(Union)");
              *puVar3 = *puVar3 + 1;
              if (set == (lyxp_set *)0x0) break;
              set_fill_set(&local_a8,(lyxp_set *)auStack_f8);
              iVar7 = eval_expr_select(exp,puVar3,LYXP_EXPR_UNION,local_40,local_38,&local_a8,
                                       options);
              set = local_58;
              param_5 = local_38;
              uVar5 = CONCAT44(extraout_var_13,iVar7);
              if (iVar7 != 0) goto LAB_0016ed2e;
              if ((options & 0x1cU) == 0) {
                iVar7 = moveto_union(local_58,&local_a8,local_40,options);
                if (iVar7 != 0) goto LAB_0016ed23;
              }
              else {
                set_snode_merge(local_58,&local_a8);
              }
            }
            iVar7 = eval_expr_select(exp,puVar3,LYXP_EXPR_UNION,local_40,local_38,(lyxp_set *)0x0,
                                     options);
            param_5 = local_38;
            uVar5 = CONCAT44(extraout_var_14,iVar7);
          } while (iVar7 == 0);
        }
        break;
      default:
        if (param_5 == (lys_module *)0x0) {
          plVar19 = (ly_ctx *)0x0;
        }
        else {
          plVar19 = param_5->ctx;
        }
        ly_log(plVar19,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
               ,0x20eb);
        return -1;
      }
LAB_0016ed2e:
      local_48 = uVar5;
      plVar14 = local_40;
      lyxp_set_cast((lyxp_set *)auStack_f8,LYXP_SET_EMPTY,local_40,param_5,options);
      lyxp_set_cast(&local_a8,LYXP_SET_EMPTY,plVar14,param_5,options);
      return (int)local_48;
    }
  }
switchD_0016dc3f_caseD_0:
  switch(exp->tokens[uVar17]) {
  case LYXP_TOKEN_PAR1:
    pcVar10 = "parsed";
    if (set == (lyxp_set *)0x0) {
      pcVar10 = "skipped";
    }
    ly_log_dbg(8,"%-27s %s %s[%u]","eval_path_expr",pcVar10,"(",(ulong)exp->expr_pos[uVar17]);
    *exp_idx = *exp_idx + 1;
    local_38 = param_5;
    iVar7 = eval_expr_select(exp,exp_idx,LYXP_EXPR_NONE,local_40,param_5,set,options);
    puVar3 = local_50;
    if (iVar7 == -1) {
      return -1;
    }
    if (iVar7 == 1) {
      return 1;
    }
    if (exp->tokens[*local_50] != LYXP_TOKEN_PAR2) {
      local_b8 = exp;
      __assert_fail("exp->tokens[*exp_idx] == LYXP_TOKEN_PAR2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                    ,0x1dd4,
                    "int eval_path_expr(struct lyxp_expr *, uint16_t *, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                   );
    }
    iVar7 = 0;
    local_b8 = exp;
    ly_log_dbg(8,"%-27s %s %s[%u]","eval_path_expr",pcVar10,")",(ulong)exp->expr_pos[*local_50]);
    *puVar3 = *puVar3 + 1;
    puVar3 = local_50;
    exp = local_b8;
    param_5 = local_38;
    goto LAB_0016eafa;
  default:
    plVar19 = param_5->ctx;
    pcVar10 = print_token(exp->tokens[uVar17]);
    ly_vlog(plVar19,LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,pcVar10,
            exp->expr + exp->expr_pos[*exp_idx]);
    return -1;
  case LYXP_TOKEN_DOT:
  case LYXP_TOKEN_DDOT:
  case LYXP_TOKEN_AT:
  case LYXP_TOKEN_NAMETEST:
  case LYXP_TOKEN_NODETYPE:
    iVar7 = 0;
    goto LAB_0016dc7d;
  case LYXP_TOKEN_FUNCNAME:
    plVar15 = set;
    if (set == (lyxp_set *)0x0) {
      plVar15 = (lyxp_set *)0x0;
    }
    local_b8 = exp;
    iVar7 = eval_function_call(exp,exp_idx,cur_node,param_5,plVar15,options);
    set = local_58;
    if (iVar7 != 0) {
      return iVar7;
    }
    break;
  case LYXP_TOKEN_OPERATOR_PATH:
    if (set == (lyxp_set *)0x0) {
      pcVar10 = "skipped";
    }
    else {
      if ((options & 0x1cU) == 0) {
        plVar14 = moveto_get_root(cur_node,options,(lyxp_node_type *)auStack_f8);
        plVar15 = local_58;
        lyxp_set_cast(local_58,LYXP_SET_EMPTY,cur_node,(lys_module *)0x0,options);
        if (plVar14 != (lyd_node *)0x0) {
          set_insert_node(plVar15,plVar14,0,auStack_f8._0_4_,0);
        }
      }
      else if (cur_node == (lyd_node *)0x0) {
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
               ,0x14af);
      }
      else {
        plVar9 = moveto_snode_get_root((lys_node *)cur_node,options,(lyxp_node_type *)auStack_f8);
        plVar15 = local_58;
        set_snode_clear_ctx(local_58);
        set_snode_insert_node(plVar15,plVar9,auStack_f8._0_4_);
      }
      pcVar10 = "parsed";
    }
    uVar2 = exp->tok_len[*local_50];
    pcVar11 = print_token(exp->tokens[*local_50]);
    ly_log_dbg(8,"%-27s %s %s[%u]","eval_absolute_location_path",pcVar10,pcVar11,
               (ulong)exp->expr_pos[*local_50]);
    uVar6 = *local_50 + 1;
    *local_50 = uVar6;
    set = local_58;
    if (uVar2 == 1) {
      if (exp->used == uVar6) {
        return 0;
      }
      if (LYXP_TOKEN_NODETYPE < exp->tokens[uVar6]) {
        return 0;
      }
      if ((0x6e0U >> (exp->tokens[uVar6] & (LYXP_TOKEN_OPERATOR_PATH|LYXP_TOKEN_OPERATOR_UNI)) & 1)
          == 0) {
        return 0;
      }
      iVar7 = 0;
    }
    else {
      iVar7 = 1;
    }
    goto LAB_0016dc7d;
  case LYXP_TOKEN_LITERAL:
    plVar15 = set;
    local_b8 = exp;
    if (set == (lyxp_set *)0x0 || (options & 0x1cU) != 0) {
      if (set != (lyxp_set *)0x0) {
        set_snode_clear_ctx(set);
      }
      plVar15 = (lyxp_set *)0x0;
    }
    eval_literal(local_b8,local_50,plVar15);
    break;
  case LYXP_TOKEN_NUMBER:
    if (set == (lyxp_set *)0x0 || (options & 0x1cU) != 0) {
      if (set != (lyxp_set *)0x0) {
        set_snode_clear_ctx(set);
      }
      plVar19 = param_5->ctx;
      plVar15 = (lyxp_set *)0x0;
    }
    else {
      plVar19 = param_5->ctx;
      plVar15 = set;
    }
    iVar7 = eval_number(plVar19,exp,local_50,plVar15);
    local_b8 = exp;
    if (iVar7 != 0) {
      return -1;
    }
  }
  iVar7 = 1;
  puVar3 = local_50;
  exp = local_b8;
LAB_0016eafa:
  while( true ) {
    plVar15 = local_58;
    uVar6 = *puVar3;
    if (exp->used <= uVar6) {
      return 0;
    }
    if (exp->tokens[uVar6] != LYXP_TOKEN_BRACK1) break;
    iVar8 = eval_predicate(exp,puVar3,local_40,param_5,set,options,iVar7);
    if (iVar8 != 0) {
      return iVar8;
    }
  }
  if (exp->tokens[uVar6] != LYXP_TOKEN_OPERATOR_PATH) {
    return 0;
  }
  iVar7 = 0;
  if (exp->tok_len[uVar6] != 1) {
    if (exp->tok_len[uVar6] != 2) {
      __assert_fail("exp->tok_len[*exp_idx] == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                    ,0x1e35,
                    "int eval_path_expr(struct lyxp_expr *, uint16_t *, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                   );
    }
    iVar7 = 1;
  }
  pcVar10 = "parsed";
  if (local_58 == (lyxp_set *)0x0) {
    pcVar10 = "skipped";
  }
  ly_log_dbg(8,"%-27s %s %s[%u]","eval_path_expr",pcVar10,"Operator(Path)",
             (ulong)exp->expr_pos[uVar6]);
  *local_50 = *local_50 + 1;
  cur_node = local_40;
  set = plVar15;
LAB_0016dc7d:
  iVar7 = eval_relative_location_path(exp,local_50,cur_node,param_5,iVar7,set,options);
  if (iVar7 == 0) {
    return 0;
  }
  return iVar7;
LAB_0016ed23:
  param_5 = local_38;
  uVar5 = 0xffffffffffffffff;
  goto LAB_0016ed2e;
}

Assistant:

static int
eval_expr_select(struct lyxp_expr *exp, uint16_t *exp_idx, enum lyxp_expr_type etype, struct lyd_node *cur_node,
                 struct lys_module *local_mod, struct lyxp_set *set, int options)
{
    int ret;
    uint16_t i, count;
    enum lyxp_expr_type next_etype;

    /* process operator repeats */
    if (!exp->repeat[*exp_idx]) {
        next_etype = LYXP_EXPR_NONE;
    } else {
        /* find etype repeat */
        for (i = 0; exp->repeat[*exp_idx][i] > etype; ++i);

        /* select one-priority lower because etype expression called us */
        if (i) {
            next_etype = exp->repeat[*exp_idx][i - 1];
            /* count repeats for that expression */
            for (count = 0; i && exp->repeat[*exp_idx][i - 1] == next_etype; ++count, --i);
        } else {
            next_etype = LYXP_EXPR_NONE;
        }
    }

    /* decide what expression are we parsing based on the repeat */
    switch (next_etype) {
    case LYXP_EXPR_OR:
        ret = eval_or_expr(exp, exp_idx, count, cur_node, local_mod, set, options);
        break;
    case LYXP_EXPR_AND:
        ret = eval_and_expr(exp, exp_idx, count, cur_node, local_mod, set, options);
        break;
    case LYXP_EXPR_EQUALITY:
        ret = eval_equality_expr(exp, exp_idx, count, cur_node, local_mod, set, options);
        break;
    case LYXP_EXPR_RELATIONAL:
        ret = eval_relational_expr(exp, exp_idx, count, cur_node, local_mod, set, options);
        break;
    case LYXP_EXPR_ADDITIVE:
        ret = eval_additive_expr(exp, exp_idx, count, cur_node, local_mod, set, options);
        break;
    case LYXP_EXPR_MULTIPLICATIVE:
        ret = eval_multiplicative_expr(exp, exp_idx, count, cur_node, local_mod, set, options);
        break;
    case LYXP_EXPR_UNARY:
        ret = eval_unary_expr(exp, exp_idx, count, cur_node, local_mod, set, options);
        break;
    case LYXP_EXPR_UNION:
        ret = eval_union_expr(exp, exp_idx, count, cur_node, local_mod, set, options);
        break;
    case LYXP_EXPR_NONE:
        ret = eval_path_expr(exp, exp_idx, cur_node, local_mod, set, options);
        break;
    default:
        ret = -1;
        LOGINT(local_mod ? local_mod->ctx : NULL);
        break;
    }

    return ret;
}